

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall B::~B(B *this)

{
  B *this_local;
  
  ~B(this);
  operator_delete(this);
  return;
}

Assistant:

~B(){ cout << hex << (long)this << " B destructor!" << endl; }